

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O2

void Fxu_HeapDoubleUpdate(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  Fxu_Double *pFVar1;
  Fxu_Double **ppFVar2;
  uint uVar3;
  Fxu_Double **ppFVar4;
  Fxu_Double **ppFVar5;
  
  uVar3 = pDiv->HNum;
  if (((int)uVar3 < 1) || (p->nItemsAlloc < (int)uVar3)) {
    __assert_fail("(pDiv)->HNum >= 1 && (pDiv)->HNum <= p->nItemsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapD.c"
                  ,0xe3,"void Fxu_HeapDoubleUpdate(Fxu_HeapDouble *, Fxu_Double *)");
  }
  if ((uVar3 != 1) && (p->pTree[uVar3 >> 1]->Weight < pDiv->Weight)) {
    ppFVar4 = p->pTree + pDiv->HNum;
    while( true ) {
      uVar3 = (*ppFVar4)->HNum;
      if ((int)uVar3 < 2) {
        return;
      }
      uVar3 = uVar3 >> 1;
      if ((*ppFVar4)->Weight <= p->pTree[uVar3]->Weight) break;
      ppFVar5 = p->pTree + uVar3;
      Fxu_HeapDoubleSwap(ppFVar4,ppFVar5);
      ppFVar4 = ppFVar5;
    }
    return;
  }
  uVar3 = uVar3 * 2;
  if (((p->nItems < (int)uVar3) || (p->pTree[(int)uVar3]->Weight <= pDiv->Weight)) &&
     ((p->nItems <= (int)uVar3 || (p->pTree[(int)(uVar3 | 1)]->Weight <= pDiv->Weight)))) {
    return;
  }
  ppFVar4 = p->pTree + pDiv->HNum;
  do {
    pFVar1 = *ppFVar4;
    uVar3 = pFVar1->HNum * 2;
    if (p->nItems < (int)uVar3) {
      return;
    }
    ppFVar2 = p->pTree;
    ppFVar5 = ppFVar2 + (int)uVar3;
    if ((int)uVar3 < p->nItems) {
      if (((*ppFVar5)->Weight <= pFVar1->Weight) &&
         (ppFVar2[(int)(uVar3 | 1)]->Weight <= pFVar1->Weight)) {
        return;
      }
      if ((*ppFVar5)->Weight < ppFVar2[(int)(uVar3 | 1)]->Weight) {
        ppFVar5 = ppFVar2 + (int)(uVar3 | 1);
      }
    }
    else if ((*ppFVar5)->Weight <= pFVar1->Weight) {
      return;
    }
    Fxu_HeapDoubleSwap(ppFVar4,ppFVar5);
    ppFVar4 = ppFVar5;
  } while( true );
}

Assistant:

void Fxu_HeapDoubleUpdate( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
//printf( "Updating divisor %d.\n", pDiv->Num );

    FXU_HEAP_DOUBLE_ASSERT(p,pDiv);
    if ( FXU_HEAP_DOUBLE_PARENT_EXISTS(p,pDiv) && 
         FXU_HEAP_DOUBLE_WEIGHT(pDiv) > FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_PARENT(p,pDiv) ) )
        Fxu_HeapDoubleMoveUp( p, pDiv );
    else if ( FXU_HEAP_DOUBLE_CHILD1_EXISTS(p,pDiv) && 
        FXU_HEAP_DOUBLE_WEIGHT(pDiv) < FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_CHILD1(p,pDiv) ) )
        Fxu_HeapDoubleMoveDn( p, pDiv );
    else if ( FXU_HEAP_DOUBLE_CHILD2_EXISTS(p,pDiv) && 
        FXU_HEAP_DOUBLE_WEIGHT(pDiv) < FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_CHILD2(p,pDiv) ) )
        Fxu_HeapDoubleMoveDn( p, pDiv );
}